

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenerateDeterministicKey.cpp
# Opt level: O2

Blob * jbcoin::serialize_ec_point(Blob *__return_storage_ptr__,ec_point *point)

{
  allocator_type local_11;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,0x21,&local_11);
  openssl::serialize_ec_point
            (point,(__return_storage_ptr__->
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  return __return_storage_ptr__;
}

Assistant:

static Blob serialize_ec_point (ec_point const& point)
{
    Blob result (33);

    serialize_ec_point (point, &result[0]);

    return result;
}